

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

int __thiscall
anon_unknown.dwarf_73fe78::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,int index,size_t count)

{
  ostream *poVar1;
  transform_error *this_00;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream str;
  size_t count_local;
  int index_local;
  TransformSelectorIndexes *this_local;
  
  count_local._4_4_ = index;
  if (index < 0) {
    count_local._4_4_ = (int)count + index;
  }
  if ((-1 < count_local._4_4_) && ((ulong)(long)count_local._4_4_ < count)) {
    return count_local._4_4_;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"sub-command TRANSFORM, selector ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_TransformSelector).Tag);
  poVar1 = std::operator<<(poVar1,", index: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count_local._4_4_);
  poVar1 = std::operator<<(poVar1," out of range (-");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count - 1);
  std::operator<<(poVar1,").");
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  transform_error::transform_error(this_00,&local_1c8);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              transform_error::~transform_error);
}

Assistant:

int NormalizeIndex(int index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<int>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      std::ostringstream str;
      str << "sub-command TRANSFORM, selector " << this->Tag
          << ", index: " << index << " out of range (-" << count << ", "
          << count - 1 << ").";
      throw transform_error(str.str());
    }
    return index;
  }